

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O1

void __thiscall
Test_testMultipleTransitions::~Test_testMultipleTransitions(Test_testMultipleTransitions *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual void Run()
	{
		if(Tests::messageVerbose)
			printf("Call stack when there are various transitions between NULLC and C\r\n");
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testFailureExecutor[t])
				continue;
			testsCount[t]++;
			nullcSetExecutor(testTarget[t]);
			nullres good = nullcBuild(testCallStackWhenVariousTransitions);
			if(!good)
			{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Compilation failed: %s\r\n", nullcGetLastError());
				break;
			}
			good = nullcRun();
			if(!good)
			{
				if(strcmp(error, nullcGetLastError()) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Call stack when there are various transitions between NULLC and C\r\n");

					const char *targetName = testTarget[t] == NULLC_X86 ? "X86" : (testTarget[t] == NULLC_LLVM ? "LLVM" : "REGVM");

					printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", targetName, nullcGetLastError(), error);
				}else{
					testsPassed[t]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Test should have failed.\r\n");
			}
		}
	}